

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O0

string * __thiscall banksia::WbEngine::timeLeftString_abi_cxx11_(WbEngine *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  double dVar1;
  int otime;
  int time;
  int sd;
  string s;
  int centiSeconds;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int iVar3;
  undefined4 in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  int local_90;
  int local_8c;
  int local_88;
  string local_78 [32];
  string local_58 [32];
  string local_38 [36];
  int local_14;
  
  iVar3 = *(int *)(in_RSI[6].field_2._M_allocated_capacity + 8);
  if (iVar3 == 2) {
    local_14 = (int)(*(double *)(in_RSI[6].field_2._M_allocated_capacity + 0x18) * 100.0);
    std::__cxx11::to_string(in_stack_fffffffffffffefc);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_38);
  }
  else if (iVar3 == 3) {
    local_88 = *(int *)(in_RSI[6]._M_string_length + 0x20);
    dVar1 = GameTimeController::getTimeLeft
                      ((GameTimeController *)in_RSI[6].field_2._M_allocated_capacity,local_88);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4059000000000000;
    local_8c = (int)(dVar1 * 100.0);
    dVar1 = GameTimeController::getTimeLeft
                      ((GameTimeController *)in_RSI[6].field_2._M_allocated_capacity,1 - local_88);
    local_90 = (int)(dVar1 * (double)__lhs);
    std::__cxx11::to_string(in_stack_fffffffffffffefc);
    std::operator+((char *)__lhs,in_stack_fffffffffffffeb0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffeb0);
    std::__cxx11::to_string(in_stack_fffffffffffffefc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeec,iVar3),in_RSI);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
  }
  else {
    paVar2 = (allocator *)&stack0xfffffffffffffeef;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
  }
  return in_RDI;
}

Assistant:

std::string WbEngine::timeLeftString() const
{
    switch (timeController->mode) {
        case TimeControlMode::movetime:
        {
            auto centiSeconds = static_cast<int>(timeController->time * 100);
            auto s = std::to_string(centiSeconds);
            return "time " + s + "\notim " + s;
        }
            
        case TimeControlMode::standard:
        {
            // timeController unit: second -> centi second
            auto sd = static_cast<int>(board->side);
            auto time = int(timeController->getTimeLeft(sd) * 100);
            auto otime = int(timeController->getTimeLeft(1 - sd) * 100);
            return "time " + std::to_string(time) + "\notim " + std::to_string(otime);
        }
        default:
            break;
    }
    return "";
}